

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTPNStmCompBase::fold_constants(CTPNStmCompBase *this,CTcPrsSymtab *symtab)

{
  CTPNStm *pCVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long lVar4;
  CTcTokenizer *pCVar5;
  CTPNStm **ppCVar6;
  
  ppCVar6 = &this->first_stm_;
  while (pCVar5 = G_tok, pCVar1 = *ppCVar6, pCVar1 != (CTPNStm *)0x0) {
    uVar2 = *(undefined4 *)((long)&(pCVar1->super_CTPNStmBase).file_ + 4);
    lVar4 = (pCVar1->super_CTPNStmBase).linenum_;
    uVar3 = *(undefined4 *)((long)&(pCVar1->super_CTPNStmBase).linenum_ + 4);
    *(undefined4 *)&G_tok->last_desc_ = *(undefined4 *)&(pCVar1->super_CTPNStmBase).file_;
    *(undefined4 *)((long)&pCVar5->last_desc_ + 4) = uVar2;
    *(int *)&pCVar5->last_linenum_ = (int)lVar4;
    *(undefined4 *)((long)&pCVar5->last_linenum_ + 4) = uVar3;
    (*(pCVar1->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xf])
              (pCVar1,symtab);
    ppCVar6 = &(pCVar1->super_CTPNStmBase).next_stm_;
  }
  return (CTcPrsNode *)this;
}

Assistant:

CTcPrsNode *CTPNStmCompBase::fold_constants(class CTcPrsSymtab *symtab)
{
    /* iterate through our statements and fold constants in each one */
    for (CTPNStm *cur = first_stm_ ; cur != 0 ; cur = cur->get_next_stm())
    {
        /* 
         *   set this statement's source line location to be the current
         *   location for error reporting 
         */
        G_tok->set_line_info(cur->get_source_desc(),
                             cur->get_source_linenum());

        /* 
         *   Fold constants, using the enclosing symbol table (not the
         *   local symbol table - during code generation we can resolve
         *   only to the global scope, since local scope symbols must
         *   always be resolved during parsing).  We assume that statement
         *   nodes are never replaced during constant folding, so we
         *   ignore the result of this call and keep our original
         *   statement list entry.  
         */
        cur->fold_constants(symtab);
    }

    /* 
     *   although nodes within our subtree might have been changed, this
     *   compound statement itself is unchanged by constant folding 
     */
    return this;
}